

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

int __thiscall
UnifiedRegex::WordBoundaryTestInst<false>::Print
          (WordBoundaryTestInst<false> *this,DebugWriter *w,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_015d347d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",1);
  }
  DebugWriter::Print(w,L"WordBoundaryTest");
  DebugWriter::Print(w,L"(");
  DebugWriter::PrintEOL(w,L")");
  if (DAT_015d347d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    DebugWriter::Unindent(w);
  }
  return 1;
}

Assistant:

int WordBoundaryTestInst<isNegation>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        if (isNegation)
        {
            PRINT_RE_BYTECODE_BEGIN("NegatedWordBoundaryTest");
        }
        else
        {
            PRINT_RE_BYTECODE_BEGIN("WordBoundaryTest");
        }

        PRINT_RE_BYTECODE_MID();
        PRINT_RE_BYTECODE_END();
    }